

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTests.cpp
# Opt level: O1

bool ContainsMacro(Preprocessor *preprocessor,string *macroIdentifier)

{
  bool bVar1;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  __it;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  __it_00;
  long lVar2;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  _Var3;
  string *local_50;
  TSymTable local_48;
  
  tcpp::Preprocessor::GetSymbolsTable(&local_48,preprocessor);
  lVar2 = ((long)local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  __it_00._M_current =
       local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_50 = macroIdentifier;
  if (0 < lVar2) {
    __it_00._M_current =
         local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
         super__Vector_impl_data._M_start + lVar2 * 4;
    lVar2 = lVar2 + 1;
    __it._M_current =
         local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
         super__Vector_impl_data._M_start;
    do {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                            *)&local_50,__it);
      _Var3._M_current = __it._M_current;
      if (bVar1) goto LAB_00121b29;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                            *)&local_50,__it._M_current + 1);
      _Var3._M_current = __it._M_current + 1;
      if (bVar1) goto LAB_00121b29;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                            *)&local_50,__it._M_current + 2);
      _Var3._M_current = __it._M_current + 2;
      if (bVar1) goto LAB_00121b29;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                            *)&local_50,__it._M_current + 3);
      _Var3._M_current = __it._M_current + 3;
      if (bVar1) goto LAB_00121b29;
      __it._M_current = __it._M_current + 4;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  lVar2 = ((long)local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)__it_00._M_current >> 3) *
          0x2e8ba2e8ba2e8ba3;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      _Var3._M_current =
           local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if ((lVar2 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                                *)&local_50,__it_00), _Var3._M_current = __it_00._M_current, bVar1))
      goto LAB_00121b29;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                        *)&local_50,__it_00);
    _Var3._M_current = __it_00._M_current;
    if (bVar1) goto LAB_00121b29;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>::
          operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                      *)&local_50,__it_00);
  _Var3._M_current = __it_00._M_current;
  if (!bVar1) {
    _Var3._M_current =
         local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
LAB_00121b29:
  std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>::~vector
            ((vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_> *)&local_48);
  return _Var3._M_current !=
         local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
         super__Vector_impl_data._M_finish;
}

Assistant:

static bool ContainsMacro(const Preprocessor& preprocessor, const std::string& macroIdentifier)
{
	const auto& symTable = preprocessor.GetSymbolsTable();

	auto it = std::find_if(symTable.cbegin(), symTable.cend(), [&macroIdentifier](auto&& symTableEntry)
	{
		return symTableEntry.mName == macroIdentifier;
	});

	return it != symTable.cend();
}